

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O1

bool __thiscall ON_EdgeSoftening::operator==(ON_EdgeSoftening *this,ON_EdgeSoftening *es)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  bVar1 = On(this);
  bVar2 = On(es);
  if (bVar1 == bVar2) {
    dVar3 = Softening(this);
    dVar4 = Softening(es);
    if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
      bVar1 = Chamfer(this);
      bVar2 = Chamfer(es);
      if (bVar1 == bVar2) {
        bVar1 = Faceted(this);
        bVar2 = Faceted(es);
        if (bVar1 == bVar2) {
          bVar1 = ForceSoftening(this);
          bVar2 = ForceSoftening(es);
          if (bVar1 == bVar2) {
            dVar3 = EdgeAngleThreshold(this);
            dVar4 = EdgeAngleThreshold(es);
            return (bool)(-(dVar4 == dVar3) & 1);
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_EdgeSoftening::operator == (const ON_EdgeSoftening& es) const
{
  if (On()                 != es.On())                 return false;
  if (Softening()          != es.Softening())          return false;
  if (Chamfer()            != es.Chamfer())            return false;
  if (Faceted()            != es.Faceted())            return false;
  if (ForceSoftening()     != es.ForceSoftening())     return false;
  if (EdgeAngleThreshold() != es.EdgeAngleThreshold()) return false;

  return true;
}